

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O0

void __thiscall Assimp::FlipUVsProcess::ProcessMaterial(FlipUVsProcess *this,aiMaterial *_mat)

{
  aiMaterialProperty *paVar1;
  char *pcVar2;
  int iVar3;
  Logger *this_00;
  aiUVTransform *uv;
  aiMaterialProperty *prop;
  uint a;
  aiMaterial *mat;
  aiMaterial *_mat_local;
  FlipUVsProcess *this_local;
  
  prop._4_4_ = 0;
  do {
    if (_mat->mNumProperties <= prop._4_4_) {
      return;
    }
    paVar1 = _mat->mProperties[prop._4_4_];
    if (paVar1 == (aiMaterialProperty *)0x0) {
      this_00 = DefaultLogger::get();
      Logger::debug(this_00,"Property is null");
    }
    else {
      iVar3 = strcmp((paVar1->mKey).data,"$tex.uvtrafo");
      if (iVar3 == 0) {
        if (paVar1->mDataLength < 0x14) {
          __assert_fail("prop->mDataLength >= sizeof(aiUVTransform)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/ConvertToLHProcess.cpp"
                        ,0x134,"void Assimp::FlipUVsProcess::ProcessMaterial(aiMaterial *)");
        }
        pcVar2 = paVar1->mData;
        *(float *)(pcVar2 + 4) = *(float *)(pcVar2 + 4) * -1.0;
        *(float *)(pcVar2 + 0x10) = *(float *)(pcVar2 + 0x10) * -1.0;
      }
    }
    prop._4_4_ = prop._4_4_ + 1;
  } while( true );
}

Assistant:

void FlipUVsProcess::ProcessMaterial (aiMaterial* _mat)
{
    aiMaterial* mat = (aiMaterial*)_mat;
    for (unsigned int a = 0; a < mat->mNumProperties;++a)   {
        aiMaterialProperty* prop = mat->mProperties[a];
        if( !prop ) {
            ASSIMP_LOG_DEBUG( "Property is null" );
            continue;
        }

        // UV transformation key?
        if (!::strcmp( prop->mKey.data, "$tex.uvtrafo"))    {
            ai_assert( prop->mDataLength >= sizeof(aiUVTransform));  /* something is wrong with the validation if we end up here */
            aiUVTransform* uv = (aiUVTransform*)prop->mData;

            // just flip it, that's everything
            uv->mTranslation.y *= -1.f;
            uv->mRotation *= -1.f;
        }
    }
}